

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

void QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString>,_HexString<double>_>,_HexString<double>_>_>
     ::appendTo<QChar>(type *p,QChar **out)

{
  char16_t cVar1;
  QChar *pQVar2;
  long lVar3;
  char16_t *__src;
  long in_FS_OFFSET;
  char16_t local_48 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = (p->a).a.a.m_size;
  QAbstractConcatenable::appendLatin1To((p->a).a.a,*out);
  pQVar2 = *out + lVar3;
  *out = pQVar2;
  lVar3 = (p->a).a.b.d.size;
  if (lVar3 != 0) {
    __src = (p->a).a.b.d.ptr;
    if (__src == (char16_t *)0x0) {
      __src = (char16_t *)&QString::_empty;
    }
    memcpy(pQVar2,__src,lVar3 * 2);
    pQVar2 = *out;
  }
  *out = pQVar2 + lVar3;
  builtin_memcpy(local_48,L"0123456789abcdef",0x20);
  pQVar2 = pQVar2 + lVar3 + 1;
  lVar3 = 0;
  do {
    cVar1 = local_48[*(byte *)((long)&(p->a).b.val + lVar3) & 0xf];
    *out = pQVar2;
    pQVar2[-1].ucs = cVar1;
    cVar1 = local_48[*(byte *)((long)&(p->a).b.val + lVar3) >> 4];
    *out = pQVar2 + 1;
    pQVar2->ucs = cVar1;
    pQVar2 = pQVar2 + 2;
    lVar3 = lVar3 + 1;
  } while ((int)lVar3 != 8);
  builtin_memcpy(local_48,L"0123456789abcdef",0x20);
  lVar3 = 0;
  do {
    cVar1 = local_48[*(byte *)((long)&(p->b).val + lVar3) & 0xf];
    *out = pQVar2;
    pQVar2[-1].ucs = cVar1;
    cVar1 = local_48[*(byte *)((long)&(p->b).val + lVar3) >> 4];
    *out = pQVar2 + 1;
    pQVar2->ucs = cVar1;
    lVar3 = lVar3 + 1;
    pQVar2 = pQVar2 + 2;
  } while ((int)lVar3 != 8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void appendTo(const type &p, T *&out)
    {
        QConcatenableEx<A>::appendTo(p.a, out);
        QConcatenableEx<B>::appendTo(p.b, out);
    }